

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallGenerator.cxx
# Opt level: O0

void __thiscall cmInstallGenerator::GenerateScript(cmInstallGenerator *this,ostream *os)

{
  cmScriptGeneratorIndent *this_00;
  char *component;
  ostream *poVar1;
  int local_50 [4];
  undefined1 local_40 [8];
  string component_test;
  Indent indent;
  ostream *os_local;
  cmInstallGenerator *this_local;
  
  this_00 = (cmScriptGeneratorIndent *)((long)&component_test.field_2 + 0xc);
  cmScriptGeneratorIndent::cmScriptGeneratorIndent(this_00);
  component = (char *)std::__cxx11::string::c_str();
  CreateComponentTest_abi_cxx11_((string *)local_40,this,component);
  poVar1 = ::operator<<(os,this_00);
  poVar1 = std::operator<<(poVar1,"if(");
  poVar1 = std::operator<<(poVar1,(string *)local_40);
  std::operator<<(poVar1,")\n");
  local_50[0] = (int)cmScriptGeneratorIndent::Next
                               ((cmScriptGeneratorIndent *)((long)&component_test.field_2 + 0xc),2);
  (*(this->super_cmScriptGenerator)._vptr_cmScriptGenerator[3])(this,os,local_50);
  poVar1 = ::operator<<(os,(cmScriptGeneratorIndent *)((long)&component_test.field_2 + 0xc));
  std::operator<<(poVar1,"endif()\n\n");
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void cmInstallGenerator::GenerateScript(std::ostream& os)
{
  // Track indentation.
  Indent indent;

  // Begin this block of installation.
  std::string component_test =
    this->CreateComponentTest(this->Component.c_str());
  os << indent << "if(" << component_test << ")\n";

  // Generate the script possibly with per-configuration code.
  this->GenerateScriptConfigs(os, indent.Next());

  // End this block of installation.
  os << indent << "endif()\n\n";
}